

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Clara::CommandLine<Catch::ConfigData>::Arg::Arg(Arg *this)

{
  CommonArgProperties<Catch::ConfigData>::CommonArgProperties
            (&this->super_CommonArgProperties<Catch::ConfigData>);
  (this->super_OptionArgProperties).shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_OptionArgProperties).shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_OptionArgProperties).shortNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_OptionArgProperties).longName._M_dataplus._M_p =
       (pointer)&(this->super_OptionArgProperties).longName.field_2;
  (this->super_OptionArgProperties).longName._M_string_length = 0;
  (this->super_OptionArgProperties).longName.field_2._M_local_buf[0] = '\0';
  (this->super_PositionalArgProperties).position = -1;
  return;
}

Assistant:

Arg() {}